

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<long_double>_>::VerifySymmetry(TPZMatrix<Fad<long_double>_> *this,REAL tol)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  longdouble *plVar7;
  ulong uVar8;
  longdouble *plVar9;
  long lVar10;
  Fad<long_double> exp;
  long local_108;
  long local_f8;
  Fad<long_double> local_e8;
  long local_b0;
  REAL local_a8;
  double local_a0;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  local_b0 = (this->super_TPZBaseMatrix).fRow;
  uVar4 = 0;
  if (local_b0 == (this->super_TPZBaseMatrix).fCol) {
    bVar3 = local_b0 < 1;
    if (0 < local_b0) {
      local_f8 = 1;
      local_108 = 0;
      local_a8 = tol;
      do {
        lVar10 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_98,this,local_108,lVar10);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_68,this,lVar10);
          iVar2 = local_68.dx_.num_elts;
          iVar1 = local_98.dx_.num_elts;
          local_e8.val_ = local_98.val_ - local_68.val_;
          uVar4 = local_68.dx_.num_elts;
          if (local_68.dx_.num_elts < local_98.dx_.num_elts) {
            uVar4 = local_98.dx_.num_elts;
          }
          local_e8.dx_.num_elts = 0;
          local_e8.dx_.ptr_to_data = (longdouble *)0x0;
          if (0 < (int)uVar4) {
            uVar8 = (ulong)uVar4;
            local_e8.dx_.num_elts = uVar4;
            local_e8.dx_.ptr_to_data = (longdouble *)operator_new__(uVar8 << 4);
            if (0 < (int)uVar4) {
              lVar6 = 0;
              do {
                plVar7 = (longdouble *)((long)local_98.dx_.ptr_to_data + lVar6);
                if (iVar1 == 0) {
                  plVar7 = &local_98.defaultVal;
                }
                plVar9 = (longdouble *)((long)local_68.dx_.ptr_to_data + lVar6);
                if (iVar2 == 0) {
                  plVar9 = &local_68.defaultVal;
                }
                *(longdouble *)((long)local_e8.dx_.ptr_to_data + lVar6) = *plVar7 - *plVar9;
                lVar6 = lVar6 + 0x10;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
          local_e8.defaultVal = (longdouble)0;
          Fad<long_double>::~Fad(&local_68);
          Fad<long_double>::~Fad(&local_98);
          local_a0 = (double)local_e8.val_;
          if (local_a8 < ABS(local_a0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  -> ",5);
            poVar5 = ::operator<<(poVar5,&local_e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_98,this,local_108,lVar10);
            poVar5 = ::operator<<(poVar5,&local_98);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            Fad<long_double>::~Fad(&local_98);
            Fad<long_double>::~Fad(&local_e8);
            goto LAB_00ca1ae4;
          }
          Fad<long_double>::~Fad(&local_e8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != local_f8);
        local_108 = local_108 + 1;
        local_f8 = local_f8 + 1;
        bVar3 = local_b0 <= local_108;
      } while (local_108 != local_b0);
    }
LAB_00ca1ae4:
    uVar4 = (uint)bVar3;
  }
  return uVar4;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}